

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000198fa0 = 0x2d2d2d2d2d2d2d;
    uRam0000000000198fa7._0_1_ = '-';
    uRam0000000000198fa7._1_1_ = '-';
    uRam0000000000198fa7._2_1_ = '-';
    uRam0000000000198fa7._3_1_ = '-';
    uRam0000000000198fa7._4_1_ = '-';
    uRam0000000000198fa7._5_1_ = '-';
    uRam0000000000198fa7._6_1_ = '-';
    uRam0000000000198fa7._7_1_ = '-';
    DAT_00198f90 = '-';
    DAT_00198f90_1._0_1_ = '-';
    DAT_00198f90_1._1_1_ = '-';
    DAT_00198f90_1._2_1_ = '-';
    DAT_00198f90_1._3_1_ = '-';
    DAT_00198f90_1._4_1_ = '-';
    DAT_00198f90_1._5_1_ = '-';
    DAT_00198f90_1._6_1_ = '-';
    uRam0000000000198f98 = 0x2d2d2d2d2d2d2d;
    DAT_00198f9f = 0x2d;
    DAT_00198f80 = '-';
    DAT_00198f80_1._0_1_ = '-';
    DAT_00198f80_1._1_1_ = '-';
    DAT_00198f80_1._2_1_ = '-';
    DAT_00198f80_1._3_1_ = '-';
    DAT_00198f80_1._4_1_ = '-';
    DAT_00198f80_1._5_1_ = '-';
    DAT_00198f80_1._6_1_ = '-';
    uRam0000000000198f88._0_1_ = '-';
    uRam0000000000198f88._1_1_ = '-';
    uRam0000000000198f88._2_1_ = '-';
    uRam0000000000198f88._3_1_ = '-';
    uRam0000000000198f88._4_1_ = '-';
    uRam0000000000198f88._5_1_ = '-';
    uRam0000000000198f88._6_1_ = '-';
    uRam0000000000198f88._7_1_ = '-';
    DAT_00198f70 = '-';
    DAT_00198f70_1._0_1_ = '-';
    DAT_00198f70_1._1_1_ = '-';
    DAT_00198f70_1._2_1_ = '-';
    DAT_00198f70_1._3_1_ = '-';
    DAT_00198f70_1._4_1_ = '-';
    DAT_00198f70_1._5_1_ = '-';
    DAT_00198f70_1._6_1_ = '-';
    uRam0000000000198f78._0_1_ = '-';
    uRam0000000000198f78._1_1_ = '-';
    uRam0000000000198f78._2_1_ = '-';
    uRam0000000000198f78._3_1_ = '-';
    uRam0000000000198f78._4_1_ = '-';
    uRam0000000000198f78._5_1_ = '-';
    uRam0000000000198f78._6_1_ = '-';
    uRam0000000000198f78._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000198f68._0_1_ = '-';
    uRam0000000000198f68._1_1_ = '-';
    uRam0000000000198f68._2_1_ = '-';
    uRam0000000000198f68._3_1_ = '-';
    uRam0000000000198f68._4_1_ = '-';
    uRam0000000000198f68._5_1_ = '-';
    uRam0000000000198f68._6_1_ = '-';
    uRam0000000000198f68._7_1_ = '-';
    DAT_00198faf = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}